

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDHash::Read(ON_SubDHash *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  ON_SubDHashType OVar2;
  byte local_27;
  bool local_26;
  byte local_25;
  int local_24;
  uchar hash_type_as_unsigned;
  bool bIsEmpty;
  bool rc;
  ON_BinaryArchive *pOStack_20;
  int chunk_version;
  ON_BinaryArchive *archive_local;
  ON_SubDHash *this_local;
  
  pOStack_20 = archive;
  archive_local = (ON_BinaryArchive *)this;
  memcpy(this,&Empty,0x5c);
  local_24 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(pOStack_20,&local_24);
  if (bVar1) {
    local_25 = 0;
    local_26 = true;
    bVar1 = ON_BinaryArchive::ReadBool(pOStack_20,&local_26);
    if (bVar1) {
      if ((local_26 & 1U) == 0) {
        local_27 = 0;
        bVar1 = ON_BinaryArchive::ReadChar(pOStack_20,&local_27);
        if (bVar1) {
          OVar2 = ON_SubDHashTypeFromUnsigned((uint)local_27);
          this->m_hash_type = OVar2;
          bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&this->m_vertex_count);
          if ((((bVar1) && (bVar1 = ON_SHA1_Hash::Read(&this->m_vertex_hash,pOStack_20), bVar1)) &&
              (bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&this->m_edge_count), bVar1)) &&
             (((bVar1 = ON_SHA1_Hash::Read(&this->m_edge_hash,pOStack_20), bVar1 &&
               (bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&this->m_face_count), bVar1)) &&
              (bVar1 = ON_SHA1_Hash::Read(&this->m_face_hash,pOStack_20), bVar1)))) {
            local_25 = 1;
          }
        }
      }
      else {
        local_25 = 1;
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_20);
    if (!bVar1) {
      local_25 = 0;
    }
    this_local._7_1_ = (bool)(local_25 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDHash::Read(class ON_BinaryArchive& archive)
{
  *this = ON_SubDHash::Empty;

  int chunk_version = 0;
  if (false == archive.BeginRead3dmAnonymousChunk(&chunk_version))
    return false;

  bool rc = false;
  for (;;)
  {
    bool bIsEmpty = true;
    if (false == archive.ReadBool(&bIsEmpty))
      break;
    if (bIsEmpty)
    {
      rc = true;
      break;
    }

    // The SubD runtime serial number and geometry content serial numbers are runtime values.
    // When appropriate, calling contexts need to set these after reading.
    unsigned char hash_type_as_unsigned = 0;
    if (false == archive.ReadChar(&hash_type_as_unsigned))
      break;
    m_hash_type = ON_SubDHashTypeFromUnsigned(hash_type_as_unsigned);

    if (false == archive.ReadInt(&m_vertex_count))
      break;
    if (false == this->m_vertex_hash.Read(archive))
      break;
    if (false == archive.ReadInt(&m_edge_count))
      break;
    if (false == this->m_edge_hash.Read(archive))
      break;
    if (false == archive.ReadInt(&m_face_count))
      break;
    if (false == this->m_face_hash.Read(archive))
      break;
    rc = true;
    break;
  }

  if (false == archive.EndRead3dmChunk())
    rc = false;
  return rc;

}